

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsqltablemodel.cpp
# Opt level: O1

bool __thiscall QSqlTableModel::isDirty(QSqlTableModel *this,QModelIndex *index)

{
  int iVar1;
  long lVar2;
  bool bVar3;
  const_iterator cVar4;
  const_iterator cVar5;
  long in_FS_OFFSET;
  int local_1c;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  bVar3 = false;
  if (((index->r < 0) || (bVar3 = false, index->c < 0)) ||
     (bVar3 = false, (index->m).ptr == (QAbstractItemModel *)0x0)) goto LAB_0013ab9c;
  lVar2 = *(long *)&(this->super_QSqlQueryModel).field_0x8;
  local_1c = index->r;
  cVar4 = QMap<int,_QSqlTableModelPrivate::ModifiedRow>::find
                    ((QMap<int,_QSqlTableModelPrivate::ModifiedRow> *)(lVar2 + 0x2e0),&local_1c);
  cVar5._M_node = *(_Base_ptr *)(lVar2 + 0x2e0);
  if (cVar5._M_node != (_Base_ptr)0x0) {
    cVar5._M_node = (_Base_ptr)&(cVar5._M_node)->_M_left;
  }
  if ((cVar4.i._M_node != (const_iterator)cVar5._M_node) &&
     (*(char *)((long)cVar4.i._M_node + 0x40) == '\0')) {
    iVar1 = *(int *)((long)cVar4.i._M_node + 0x28);
    bVar3 = true;
    if ((iVar1 == 1) || (iVar1 == 3)) goto LAB_0013ab9c;
    if (iVar1 == 2) {
      bVar3 = QSqlRecord::isGenerated((QSqlRecord *)((long)cVar4.i._M_node + 0x30),index->c);
      goto LAB_0013ab9c;
    }
  }
  bVar3 = false;
LAB_0013ab9c:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool QSqlTableModel::isDirty(const QModelIndex &index) const
{
    Q_D(const QSqlTableModel);
    if (!index.isValid())
        return false;

    const auto it = d->cache.constFind(index.row());
    if (it == d->cache.constEnd())
        return false;
    const QSqlTableModelPrivate::ModifiedRow &row = *it;
    if (row.submitted())
        return false;

    return row.op() == QSqlTableModelPrivate::Insert
           || row.op() == QSqlTableModelPrivate::Delete
           || (row.op() == QSqlTableModelPrivate::Update
               && row.rec().isGenerated(index.column()));
}